

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O0

int jpc_enc_enccblks(jpc_enc_t *enc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  jpc_enc_tile_t *pjVar4;
  jpc_enc_tcmpt_t *pjVar5;
  jpc_enc_rlvl_t *pjVar6;
  jpc_enc_band_t *pjVar7;
  int iVar8;
  jpc_enc_cblk_t *pjVar9;
  jas_matind_t jVar10;
  jas_seqent_t jVar11;
  int local_b4;
  long local_b0;
  long local_98;
  jas_matind_t j;
  jas_matind_t i;
  jpc_enc_prc_t *prc;
  uint_fast32_t prcno;
  jpc_enc_tile_t *tile;
  jpc_fix_t v;
  jpc_fix_t bmx;
  jpc_fix_t mx;
  jpc_enc_cblk_t *endcblks;
  jpc_enc_cblk_t *cblk;
  jpc_enc_band_t *endbands;
  jpc_enc_band_t *band;
  jpc_enc_rlvl_t *endlvls;
  jpc_enc_rlvl_t *lvl;
  jpc_enc_tcmpt_t *endcomps;
  jpc_enc_tcmpt_t *tcmpt;
  jpc_enc_t *enc_local;
  
  pjVar4 = enc->curtile;
  pjVar5 = pjVar4->tcmpts;
  uVar1 = pjVar4->numtcmpts;
  endcomps = pjVar4->tcmpts;
  do {
    if (endcomps == pjVar5 + uVar1) {
      return 0;
    }
    pjVar6 = endcomps->rlvls;
    uVar2 = endcomps->numrlvls;
    for (endlvls = endcomps->rlvls; endlvls != pjVar6 + uVar2; endlvls = endlvls + 1) {
      if (endlvls->bands != (jpc_enc_band_t *)0x0) {
        pjVar7 = endlvls->bands;
        uVar3 = endlvls->numbands;
        for (endbands = endlvls->bands; endbands != pjVar7 + uVar3; endbands = endbands + 1) {
          if (endbands->data != (jas_matrix_t *)0x0) {
            prc = (jpc_enc_prc_t *)0x0;
            i = (jas_matind_t)endbands->prcs;
            for (; prc < (jpc_enc_prc_t *)(ulong)endlvls->numprcs;
                prc = (jpc_enc_prc_t *)((long)&prc->tlx + 1)) {
              if (*(long *)(i + 0x30) != 0) {
                v = 0;
                pjVar9 = (jpc_enc_cblk_t *)(*(long *)(i + 0x30) + (ulong)*(uint *)(i + 0x28) * 0x68)
                ;
                for (endcblks = *(jpc_enc_cblk_t **)(i + 0x30); endcblks != pjVar9;
                    endcblks = endcblks + 1) {
                  bmx = 0;
                  for (j = 0; jVar10 = jas_matrix_numrows(endcblks->data), j < jVar10; j = j + 1) {
                    for (local_98 = 0; jVar10 = jas_matrix_numcols(endcblks->data),
                        local_98 < jVar10; local_98 = local_98 + 1) {
                      jVar11 = jas_matrix_get(endcblks->data,j,local_98);
                      if (jVar11 < 0) {
                        jVar11 = jas_matrix_get(endcblks->data,j,local_98);
                        local_b0 = -jVar11;
                      }
                      else {
                        local_b0 = jas_matrix_get(endcblks->data,j,local_98);
                      }
                      if (bmx < local_b0) {
                        bmx = local_b0;
                      }
                    }
                  }
                  if (v < bmx) {
                    v = bmx;
                  }
                  iVar8 = jpc_fix_firstone(bmx);
                  if (iVar8 + -5 < 1) {
                    local_b4 = 0;
                  }
                  else {
                    local_b4 = jpc_fix_firstone(bmx);
                    local_b4 = local_b4 + -5;
                  }
                  endcblks->numbps = local_b4;
                }
                for (endcblks = *(jpc_enc_cblk_t **)(i + 0x30); endcblks != pjVar9;
                    endcblks = endcblks + 1) {
                  endcblks->numimsbs = endbands->numbps - endcblks->numbps;
                  if (endcblks->numimsbs < 0) {
                    __assert_fail("cblk->numimsbs >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0xa1,"int jpc_enc_enccblks(jpc_enc_t *)");
                  }
                }
                for (endcblks = *(jpc_enc_cblk_t **)(i + 0x30); endcblks != pjVar9;
                    endcblks = endcblks + 1) {
                  iVar8 = jpc_enc_enccblk(endcomps,endbands,endcblks);
                  if (iVar8 != 0) {
                    return -1;
                  }
                }
              }
              i = i + 0x60;
            }
          }
        }
      }
    }
    endcomps = endcomps + 1;
  } while( true );
}

Assistant:

int jpc_enc_enccblks(jpc_enc_t *enc)
{
	jpc_enc_tcmpt_t *tcmpt;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_fix_t mx;
	jpc_fix_t bmx;
	jpc_fix_t v;
	jpc_enc_tile_t *tile;
	uint_fast32_t prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (tcmpt = tile->tcmpts; tcmpt != endcomps; ++tcmpt) {
		endlvls = &tcmpt->rlvls[tcmpt->numrlvls];
		for (lvl = tcmpt->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					bmx = 0;
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						mx = 0;
						for (jas_matind_t i = 0; i < jas_matrix_numrows(cblk->data); ++i) {
							for (jas_matind_t j = 0; j < jas_matrix_numcols(cblk->data); ++j) {
								v = JAS_ABS(jas_matrix_get(cblk->data, i, j));
								if (v > mx) {
									mx = v;
								}
							}
						}
						if (mx > bmx) {
							bmx = mx;
						}
						cblk->numbps = JAS_MAX(jpc_fix_firstone(mx) + 1 - JPC_NUMEXTRABITS, 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->numimsbs = band->numbps - cblk->numbps;
						assert(cblk->numimsbs >= 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						if (jpc_enc_enccblk(tcmpt, band, cblk)) {
							return -1;
						}
					}
				}
			}
		}
	}
	return 0;
}